

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O2

bool __thiscall Teleport::Stream::Read(Stream *this,float *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->readpos;
  iVar2 = this->writepos;
  if (iVar1 != iVar2) {
    iVar3 = 0;
    if (iVar1 != 0x15887) {
      iVar3 = iVar1 + 1;
    }
    this->readpos = iVar3;
    *val = this->buffer[iVar1];
  }
  return iVar1 != iVar2;
}

Assistant:

inline bool Read(float& val)
        {
            int r = readpos;
            if (r == writepos)
                return false;
            readpos = (r == LENGTH - 1) ? 0 : (r + 1);
            val = buffer[r];
            return true;
        }